

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor::GpuCounterDescriptor
          (GpuCounterDescriptor *this,GpuCounterDescriptor *param_1)

{
  GpuCounterDescriptor *param_1_local;
  GpuCounterDescriptor *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_009c0ce8;
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
  ::vector(&this->specs_,&param_1->specs_);
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
  ::vector(&this->blocks_,&param_1->blocks_);
  this->min_sampling_period_ns_ = param_1->min_sampling_period_ns_;
  this->max_sampling_period_ns_ = param_1->max_sampling_period_ns_;
  this->supports_instrumented_sampling_ = param_1->supports_instrumented_sampling_;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

GpuCounterDescriptor::GpuCounterDescriptor(GpuCounterDescriptor&&) noexcept = default;